

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_open(lua_State *L)

{
  int iVar1;
  char *__filename;
  char *__modes;
  undefined8 *puVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  FILE *pFVar7;
  char *__s;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  puVar2 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
  puVar2[1] = 0;
  luaL_setmetatable(L,"FILE*");
  *puVar2 = 0;
  puVar2[1] = io_fclose;
  if (*__modes != '\0') {
    pvVar3 = memchr("rwa",(int)*__modes,4);
    if (pvVar3 != (void *)0x0) {
      __s = __modes + 2;
      if (__modes[1] != '+') {
        __s = __modes + 1;
      }
      sVar4 = strspn(__s,"b");
      sVar5 = strlen(__s);
      if (sVar4 == sVar5) goto LAB_0011027a;
    }
  }
  luaL_argerror(L,2,"invalid mode");
LAB_0011027a:
  piVar6 = __errno_location();
  *piVar6 = 0;
  pFVar7 = fopen64(__filename,__modes);
  *puVar2 = pFVar7;
  if (pFVar7 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = luaL_fileresult(L,0,__filename);
  return iVar1;
}

Assistant:

static int io_open (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newfile(L);
  const char *md = mode;  /* to traverse/check mode */
  luaL_argcheck(L, l_checkmode(md), 2, "invalid mode");
  errno = 0;
  p->f = fopen(filename, mode);
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}